

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O3

void chrono::collision::make_parent_relative
               (CHOBBTree *m,int bn,ChMatrix33<double> *parentR,Vector *parentTo)

{
  Vector *parentTo_00;
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChMatrix33<double> *local_38;
  pointer local_30;
  
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Rpc == '\0') {
    make_parent_relative();
  }
  if (make_parent_relative(chrono::collision::CHOBBTree*,int,chrono::ChMatrix33<double>&,chrono::ChVector<double>&)
      ::Tpc == '\0') {
    make_parent_relative();
  }
  local_30 = (m->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (-1 < local_30[bn].first_child) {
    make_parent_relative(m,local_30[bn].first_child,&local_30[bn].Rot,&local_30[bn].To);
    pCVar4 = (m->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start;
    parentTo_00 = &pCVar4[bn].To;
    make_parent_relative(m,*(int *)(parentTo_00 + 2) + 1,&pCVar4[bn].Rot,parentTo_00);
    local_30 = (m->b).
               super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  local_30 = local_30 + bn;
  local_38 = parentR;
  ChMatrix33<double>::operator=
            (&make_parent_relative::Rpc,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_38);
  dVar5 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  pCVar4 = (m->b).
           super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(double *)
   &pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> =
       make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)&pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8) = dVar5;
  dVar5 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  pdVar1 = (double *)
           ((long)&pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  pdVar1[1] = dVar5;
  dVar5 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  pdVar1 = (double *)
           ((long)&pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  pdVar1[1] = dVar5;
  dVar5 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  pdVar1 = (double *)
           ((long)&pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
  *pdVar1 = make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  pdVar1[1] = dVar5;
  *(double *)
   ((long)&pCVar4[bn].Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40) =
       make_parent_relative::Rpc.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar4 = (m->b).
           super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = pCVar4[bn].To.m_data[1] - parentTo->m_data[1];
  dVar6 = pCVar4[bn].To.m_data[0] - parentTo->m_data[0];
  dVar7 = pCVar4[bn].To.m_data[2] - parentTo->m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar6;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       dVar5 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar2 = vfmadd231sd_fma(auVar13,auVar8,auVar2);
  auVar10._0_8_ =
       dVar5 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar10._8_8_ =
       dVar5 * (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar9._8_8_ = dVar6;
  auVar9._0_8_ = dVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7;
  auVar3 = vfmadd231sd_fma(auVar2,auVar12,auVar3);
  auVar2 = vfmadd132pd_fma(auVar9,auVar10,
                           *(undefined1 (*) [16])
                            (parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar11._8_8_ = dVar7;
  auVar11._0_8_ = dVar7;
  auVar2 = vfmadd132pd_fma(auVar11,auVar2,
                           *(undefined1 (*) [16])
                            ((parentR->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 6));
  *(undefined1 (*) [16])pCVar4[bn].To.m_data = auVar2;
  pCVar4[bn].To.m_data[2] = auVar3._0_8_;
  return;
}

Assistant:

void make_parent_relative(CHOBBTree* m, int bn, ChMatrix33<>& parentR, Vector& parentTo) {
    static ChMatrix33<> Rpc;
    static Vector Tpc;

    if (!m->child(bn)->IsLeaf()) {
        // make children parent-relative

        make_parent_relative(m, m->child(bn)->first_child, m->child(bn)->Rot, m->child(bn)->To);
        make_parent_relative(m, m->child(bn)->first_child + 1, m->child(bn)->Rot, m->child(bn)->To);
    }

    // make self parent relative

    Rpc = parentR.transpose() * m->child(bn)->Rot;  // MTxM(Rpc,parentR,m->child(bn)->R);
    m->child(bn)->Rot = Rpc;                        // McM(m->child(bn)->R,Rpc);
    Tpc = Vsub(m->child(bn)->To, parentTo);         // VmV(Tpc,m->child(bn)->To,parentTo);
    m->child(bn)->To = parentR.transpose() * Tpc;   // Tpc MTxV(m->child(bn)->To,parentR,Tpc);
}